

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

void __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::consume_operation::commit(consume_operation *this)

{
  FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)> *pFVar1;
  void *pvVar2;
  
  if ((this->m_consume_data).m_next_ptr < 0x10) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x3a7);
  }
  pFVar1 = complete_type(this);
  pvVar2 = element_ptr(this);
  (*pFVar1->m_align_destroy)(pvVar2);
  LOCK();
  ((this->m_consume_data).m_control)->m_next = (this->m_consume_data).m_next_ptr;
  UNLOCK();
  detail::
  LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(float,_double)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  ::Consume::clean_dead_elements(&this->m_consume_data);
  (this->m_consume_data).m_next_ptr = 0;
  return;
}

Assistant:

void commit() noexcept
            {
                DENSITY_ASSERT(!empty());

                auto const & type    = complete_type();
                auto const   element = element_ptr();
                type.destroy(element);

                type.RUNTIME_TYPE::~RUNTIME_TYPE();

                m_consume_data.commit_consume_impl();
            }